

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::rotr(APInt *this,uint rotateAmt)

{
  anon_union_8_2_1313ab2f_for_U __dest;
  uint in_EDX;
  uint uVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar2;
  undefined4 in_register_00000034;
  APInt *that;
  ulong uVar3;
  APInt AVar4;
  anon_union_8_2_1313ab2f_for_U local_48;
  uint local_40;
  anon_union_8_2_1313ab2f_for_U local_38;
  uint local_30;
  
  that = (APInt *)CONCAT44(in_register_00000034,rotateAmt);
  local_30 = that->BitWidth;
  uVar1 = in_EDX % local_30;
  if (uVar1 == 0) {
    APInt(this,that);
    uVar2 = extraout_RDX;
  }
  else {
    if (local_30 < 0x41) {
      __dest.pVal = *(uint64_t **)&that->U;
    }
    else {
      uVar3 = (ulong)((uint)((ulong)local_30 + 0x3f >> 3) & 0xfffffff8);
      __dest.pVal = (uint64_t *)operator_new__(uVar3);
      memcpy(__dest.pVal,(that->U).pVal,uVar3);
    }
    local_38 = __dest;
    lshrInPlace((APInt *)&local_38,uVar1);
    local_40 = that->BitWidth;
    uVar1 = local_40 - uVar1;
    if ((ulong)local_40 < 0x41) {
      local_48.pVal = *(uint64_t **)&that->U;
    }
    else {
      uVar3 = (ulong)((uint)((ulong)local_40 + 0x3f >> 3) & 0xfffffff8);
      local_48.pVal = (uint64_t *)operator_new__(uVar3);
      memcpy(local_48.pVal,(that->U).pVal,uVar3);
    }
    operator<<=((APInt *)&local_48,uVar1);
    operator|=((APInt *)&local_48,(APInt *)&local_38);
    this->BitWidth = local_40;
    this->U = local_48;
    uVar2 = extraout_RDX_00;
    if ((0x40 < local_30) && (local_38.VAL != 0)) {
      operator_delete__(local_38.pVal);
      uVar2 = extraout_RDX_01;
    }
  }
  AVar4._8_8_ = uVar2;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt APInt::rotr(unsigned rotateAmt) const {
  rotateAmt %= BitWidth;
  if (rotateAmt == 0)
    return *this;
  return lshr(rotateAmt) | shl(BitWidth - rotateAmt);
}